

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O1

void spvtools::opt::anon_unknown_21::GetDependences
               (vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>
                *dependences,LoopDependenceAnalysis *analysis,
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               *sources,vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *destinations,size_t num_entries)

{
  pointer ppIVar1;
  Instruction *source;
  Instruction *destination;
  bool bVar2;
  pointer ppIVar3;
  DistanceVector dist;
  allocator_type local_99;
  pointer local_98;
  pointer local_90;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_88;
  vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_> *local_80;
  size_t local_78;
  value_type local_70;
  value_type local_58;
  
  local_98 = (sources->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_90 = (sources->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_98 != local_90) {
    local_88 = destinations;
    local_80 = dependences;
    local_78 = num_entries;
    do {
      ppIVar3 = (local_88->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppIVar1 = (local_88->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (ppIVar3 != ppIVar1) {
        source = *local_98;
        do {
          destination = *ppIVar3;
          local_58.dependence_information = UNKNOWN;
          local_58.direction = ALL;
          local_58.distance = 0;
          local_58.peel_first = false;
          local_58.peel_last = false;
          local_58.point_x = 0;
          local_58.point_y = 0;
          std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
          vector(&local_70.entries,local_78,&local_58,&local_99);
          bVar2 = LoopDependenceAnalysis::GetDependence(analysis,source,destination,&local_70);
          if (!bVar2) {
            std::
            vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>::
            push_back(local_80,&local_70);
          }
          if (local_70.entries.
              super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.entries.
                            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_70.entries.
                                  super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_70.entries.
                                  super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          ppIVar3 = ppIVar3 + 1;
        } while (ppIVar3 != ppIVar1);
      }
      local_98 = local_98 + 1;
    } while (local_98 != local_90);
  }
  return;
}

Assistant:

void GetDependences(std::vector<DistanceVector>* dependences,
                    LoopDependenceAnalysis* analysis,
                    const std::vector<Instruction*>& sources,
                    const std::vector<Instruction*>& destinations,
                    size_t num_entries) {
  for (auto source : sources) {
    for (auto destination : destinations) {
      DistanceVector dist(num_entries);
      if (!analysis->GetDependence(source, destination, &dist)) {
        dependences->push_back(dist);
      }
    }
  }
}